

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var instance;
  Var pvVar7;
  RecyclableObject *this_01;
  JavascriptPromise *promise;
  RecyclableObject *constructor;
  JavascriptMethod p_Var8;
  uint uVar9;
  int32 hCode;
  int in_stack_00000010;
  Arguments local_98;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  JavascriptPromiseResolveOrRejectFunction *resolve;
  JavascriptPromiseResolveOrRejectFunction *reject;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x19,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cec1b8;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  reject = (JavascriptPromiseResolveOrRejectFunction *)callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&reject,(CallInfo *)&args.super_Arguments.Values);
  uVar9 = (uint)reject;
  if (((ulong)reject & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00cec1b8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar9 = (uint)reject;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  instance = CallInfo::GetNewTarget(uVar9 >> 0x18,(Var *)args.super_Arguments.Info,uVar9 & 0xffffff)
  ;
  local_98.Info = (Type)reject;
  local_98.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_98);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,(CallInfo)args.super_Arguments.Values,
             L"Promise",&stack0x00000000);
  hCode = -0x7ff5ea00;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    if (instance != (Var)0x0) {
      BVar5 = JavascriptOperators::IsUndefined(instance);
      if (BVar5 != 0) goto LAB_00cec1a6;
    }
    hCode = -0x7ff5ec34;
    if (((ulong)reject & 0xfffffe) != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&reject,1);
      bVar4 = JavascriptConversion::IsCallable(pvVar7);
      if (bVar4) {
        pvVar7 = Arguments::operator[]((Arguments *)&reject,1);
        this_01 = VarTo<Js::RecyclableObject>(pvVar7);
        promise = JavascriptLibrary::CreatePromise(this);
        if (bVar3) {
          constructor = VarTo<Js::RecyclableObject>(instance);
          JavascriptOperators::OrdinaryCreateFromConstructor
                    (constructor,(RecyclableObject *)promise,
                     (this->super_JavascriptLibraryBase).promisePrototype.ptr,pSVar1);
        }
        InitializePromise(promise,(JavascriptPromiseResolveOrRejectFunction **)&__tag.entry.next,
                          &resolve,pSVar1);
        this_00 = pSVar1->threadContext;
        bVar3 = this_00->reentrancySafeOrHandled;
        this_00->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
        if (pSVar1->threadContext->noJsReentrancy != true) {
          p_Var8 = RecyclableObject::GetEntryPoint(this_01);
          CheckIsExecutable(this_01,p_Var8);
          p_Var8 = RecyclableObject::GetEntryPoint(this_01);
          (*p_Var8)(this_01,(CallInfo)this_01,0x2000003,0,0,0,0,0x2000003,
                    (this->super_JavascriptLibraryBase).undefinedValue.ptr,__tag.entry.next,resolve)
          ;
          this_00->reentrancySafeOrHandled = bVar3;
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_88);
          return promise;
        }
        Throw::FatalJsReentrancyError();
      }
    }
  }
LAB_00cec1a6:
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Promise");
}

Assistant:

Var JavascriptPromise::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Promise, scriptContext);

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise"));

        // 1. If NewTarget is undefined, throw a TypeError exception.
        if ((callInfo.Flags & CallFlags_New) != CallFlags_New || (newTarget != nullptr && JavascriptOperators::IsUndefined(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("Promise"));
        }

        // 2. If IsCallable(executor) is false, throw a TypeError exception.
        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise"));
        }
        RecyclableObject* executor = VarTo<RecyclableObject>(args[1]);

        // 3. Let promise be ? OrdinaryCreateFromConstructor(NewTarget, "%PromisePrototype%", <<[[PromiseState]], [[PromiseResult]], [[PromiseFulfillReactions]], [[PromiseRejectReactions]], [[PromiseIsHandled]] >>).
        JavascriptPromise* promise = library->CreatePromise();
        if (isCtorSuperCall)
        {
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), promise, library->GetPromisePrototype(), scriptContext);
        }

        JavascriptPromiseResolveOrRejectFunction* resolve;
        JavascriptPromiseResolveOrRejectFunction* reject;

        // 4. Set promise's [[PromiseState]] internal slot to "pending".
        // 5. Set promise's [[PromiseFulfillReactions]] internal slot to a new empty List.
        // 6. Set promise's [[PromiseRejectReactions]] internal slot to a new empty List.
        // 7. Set promise's [[PromiseIsHandled]] internal slot to false.
        // 8. Let resolvingFunctions be CreateResolvingFunctions(promise).
        InitializePromise(promise, &resolve, &reject, scriptContext);

        JavascriptExceptionObject* exception = nullptr;

        // 9. Let completion be Call(executor, undefined, << resolvingFunctions.[[Resolve]], resolvingFunctions.[[Reject]] >>).
        try
        {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                        executor, CallInfo(CallFlags_Value, 3),
                        library->GetUndefined(),
                        resolve,
                        reject);
            }
            END_SAFE_REENTRANT_CALL
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            // 10. If completion is an abrupt completion, then
            //    a. Perform ? Call(resolvingFunctions.[[Reject]], undefined, << completion.[[Value]] >>).
            TryRejectWithExceptionObject(exception, reject, scriptContext);
        }

        // 11. Return promise.
        return promise;
    }